

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

uint32 Unicode::fromString(char *ch,usize len)

{
  usize uVar1;
  int local_2c;
  uint32 result;
  usize reqLen;
  usize len_local;
  char *ch_local;
  
  if (len == 0) {
    return 0;
  }
  if ((*ch & 0x80U) == 0) {
    return (uint)(byte)*ch;
  }
  uVar1 = length(*ch);
  if (len < uVar1) {
    return 0;
  }
  local_2c = 0;
  len_local = (usize)ch;
  if (uVar1 != 2) {
    len_local = (usize)ch;
    if (uVar1 != 3) {
      len_local = (usize)ch;
      if (uVar1 != 4) goto LAB_00109752;
      len_local = (usize)(ch + 1);
      local_2c = (uint)(byte)*ch << 6;
    }
    local_2c = ((uint)*(byte *)len_local + local_2c) * 0x40;
    len_local = len_local + 1;
  }
  local_2c = ((uint)*(byte *)len_local + local_2c) * 0x40;
  len_local = len_local + 1;
LAB_00109752:
  return ((uint)*(byte *)len_local + local_2c) - fromString::utf8Offsets[uVar1];
}

Assistant:

static uint32 fromString(const char* ch, usize len)
  {
    if(len == 0)
      return 0;
    if((*(const uchar*)ch & 0x80) == 0) // ch < 0x80
      return *(const uchar*)ch;
    usize reqLen = length(*ch);
    if(len < reqLen)
      return 0;
    static const uint32 utf8Offsets[] = {0UL, 0UL, 0x00003080UL, 0x000E2080UL, 0x03C82080UL};
    uint32 result = 0;
    switch(reqLen)
    {
      case 4: result = (uint32)*(const uchar*)ch++ << 6;
      case 3: result += (uint32)*(const uchar*)ch++; result <<= 6;
      case 2: result += (uint32)*(const uchar*)ch++; result <<= 6;
      default: result += *(const uchar*)ch;
    }
    result -= utf8Offsets[reqLen];
    return result;
  }